

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O2

void basisu::compute_bc1_hints
               (bool *bc1_hint0,bool *bc1_hint1,uastc_encode_results *best_results,
               color_rgba (*block) [4],color_rgba (*decoded_uastc_block) [4])

{
  color_rgba *c0;
  char cVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  unpacked_uastc_block *puVar6;
  unpacked_uastc_block *puVar7;
  color_rgba (*pacVar8) [4];
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  color_rgba (*local_2c0) [4];
  color_rgba *local_2b8;
  color_rgba (*local_2b0) [4];
  dxt1_block b;
  eac_a8_block local_288;
  etc_block etc1_blk;
  color_rgba tblock_hint1_bc1 [4] [4];
  color_rgba tblock_hint0_bc1 [4] [4];
  uastc_block temp_ublock;
  unpacked_uastc_block local_1e0;
  dxt1_block tbc1_block [8];
  color_rgba tblock_bc1 [4] [4];
  unpacked_uastc_block temp_ublock_unpacked;
  
  bVar12 = 0;
  uVar5 = (ulong)best_results->m_uastc_mode;
  *bc1_hint0 = false;
  *bc1_hint1 = false;
  if ((uVar5 != 8) &&
     ((cVar1 = basist::g_uastc_mode_has_bc1_hint0[uVar5], cVar1 != '\0' ||
      (basist::g_uastc_mode_has_bc1_hint1[uVar5] != '\0')))) {
    basist::encode_bc1(tbc1_block,(uint8_t *)decoded_uastc_block,0);
    local_2b8 = tblock_bc1[0];
    unpack_block(cBC1,tbc1_block,local_2b8);
    etc1_blk.field_0 = (anon_union_8_2_04352b30_for_etc_block_0)0x0;
    local_288 = (eac_a8_block)0x1000;
    pack_uastc(&temp_ublock,best_results,&etc1_blk,0,&local_288,false,false);
    basist::unpack_uastc(&temp_ublock,&temp_ublock_unpacked,false,true);
    local_1e0.m_etc1_g = 0;
    local_1e0.m_etc1_b = 0;
    local_1e0.m_etc1_bias = 0;
    local_1e0.m_etc2_hints = 0;
    local_1e0.m_etc1_selector = 0;
    local_1e0.m_etc1_r = 0;
    local_1e0.m_solid_color.field_0 = (anon_union_4_3_898e29d3_for_color32_0)0x0;
    local_1e0.m_bc1_hint0 = false;
    local_1e0.m_bc1_hint1 = false;
    local_1e0.m_etc1_flip = false;
    local_1e0.m_etc1_diff = false;
    local_1e0.m_etc1_inten0 = 0;
    local_1e0.m_etc1_inten1 = 0;
    local_1e0.m_mode = best_results->m_uastc_mode;
    local_1e0.m_common_pattern = best_results->m_common_pattern;
    puVar6 = &temp_ublock_unpacked;
    puVar7 = &local_1e0;
    for (lVar4 = 0x1a; lVar4 != 0; lVar4 = lVar4 + -1) {
      (puVar7->m_astc).m_weight_range = (puVar6->m_astc).m_weight_range;
      puVar6 = (unpacked_uastc_block *)((long)puVar6 + (ulong)bVar12 * -8 + 4);
      puVar7 = (unpacked_uastc_block *)((long)puVar7 + ((ulong)bVar12 * -2 + 1) * 4);
    }
    cVar2 = basist::g_uastc_mode_has_bc1_hint1[uVar5];
    if (cVar2 == '\0') {
      tblock_hint1_bc1[3][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[3][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[3][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[3][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[2][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[2][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[2][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[2][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[1][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[1][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[1][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[1][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[0][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[0][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[0][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint1_bc1[0][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
    }
    else {
      basist::transcode_uastc_to_bc1_hint1(&local_1e0,(color32 (*) [4])decoded_uastc_block,&b,false)
      ;
      unpack_block(cBC1,&b,tblock_hint1_bc1[0]);
    }
    if (cVar1 == '\0') {
      tblock_hint0_bc1[3][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[3][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[3][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[3][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[2][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[2][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[2][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[2][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[1][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[1][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[1][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[1][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[0][0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[0][1].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[0][2].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      tblock_hint0_bc1[0][3].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
    }
    else {
      basist::transcode_uastc_to_bc1_hint0(&local_1e0,&b);
      unpack_block(cBC1,&b,tblock_hint0_bc1[0]);
    }
    local_2c0 = tblock_hint0_bc1;
    pacVar8 = tblock_hint1_bc1;
    uVar10 = 0;
    uVar9 = 0;
    uVar5 = 0;
    local_2b0 = block;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 4) {
        c0 = (color_rgba *)((long)&(*local_2b0)[0].field_0 + lVar11);
        uVar3 = color_distance(c0,(color_rgba *)((long)&local_2b8->field_0 + lVar11),false);
        uVar5 = uVar5 + uVar3;
        uVar3 = color_distance(c0,(color_rgba *)((long)&(*local_2c0)[0].field_0 + lVar11),false);
        uVar9 = uVar9 + uVar3;
        uVar3 = color_distance(c0,(color_rgba *)((long)&(*pacVar8)[0].field_0 + lVar11),false);
        uVar10 = uVar10 + uVar3;
      }
      local_2b0 = local_2b0 + 1;
      local_2b8 = local_2b8 + 4;
      local_2c0 = local_2c0 + 1;
      pacVar8 = pacVar8 + 1;
    }
    if ((cVar1 != '\0') && (SQRT((float)uVar9) <= SQRT((float)uVar5) * 1.075)) {
      *bc1_hint0 = true;
    }
    if ((cVar2 != '\0') && (SQRT((float)uVar10) <= SQRT((float)uVar5) * 1.075)) {
      *bc1_hint1 = true;
    }
  }
  return;
}

Assistant:

static void compute_bc1_hints(bool &bc1_hint0, bool &bc1_hint1, const uastc_encode_results &best_results, const color_rgba block[4][4], const color_rgba decoded_uastc_block[4][4])
	{
		const uint32_t best_mode = best_results.m_uastc_mode;
		const bool perceptual = false;

		bc1_hint0 = false;
		bc1_hint1 = false;

		if (best_mode == UASTC_MODE_INDEX_SOLID_COLOR)
			return;

		if (!g_uastc_mode_has_bc1_hint0[best_mode] && !g_uastc_mode_has_bc1_hint1[best_mode])
			return;

		color_rgba tblock_bc1[4][4];
		dxt1_block tbc1_block[8];
		basist::encode_bc1(tbc1_block, (const uint8_t*)&decoded_uastc_block[0][0], 0);
		unpack_block(texture_format::cBC1, tbc1_block, &tblock_bc1[0][0]);

		color_rgba tblock_hint0_bc1[4][4];
		color_rgba tblock_hint1_bc1[4][4];
		
		etc_block etc1_blk;
		memset(&etc1_blk, 0, sizeof(etc1_blk));

		eac_a8_block etc2_blk;
		memset(&etc2_blk, 0, sizeof(etc2_blk));
		etc2_blk.m_multiplier = 1;
		
		// Pack to UASTC, then unpack, because the endpoints may be swapped.

		uastc_block temp_ublock;
		pack_uastc(temp_ublock, best_results, etc1_blk, 0, etc2_blk, false, false);

		unpacked_uastc_block temp_ublock_unpacked;
		unpack_uastc(temp_ublock, temp_ublock_unpacked, false);
										
		unpacked_uastc_block ublock = {};
		ublock.m_mode = best_results.m_uastc_mode;
		ublock.m_common_pattern = best_results.m_common_pattern;
		ublock.m_astc = temp_ublock_unpacked.m_astc;

		dxt1_block b;

		// HINT1
		if (!g_uastc_mode_has_bc1_hint1[best_mode])
		{
			memset(tblock_hint1_bc1, 0, sizeof(tblock_hint1_bc1));
		}
		else
		{
			transcode_uastc_to_bc1_hint1(ublock, (color32 (*)[4]) decoded_uastc_block, &b, false);

			unpack_block(texture_format::cBC1, &b, &tblock_hint1_bc1[0][0]);
		}

		// HINT0
		if (!g_uastc_mode_has_bc1_hint0[best_mode])
		{
			memset(tblock_hint0_bc1, 0, sizeof(tblock_hint0_bc1));
		}
		else
		{
			transcode_uastc_to_bc1_hint0(ublock, &b);
			
			unpack_block(texture_format::cBC1, &b, &tblock_hint0_bc1[0][0]);
		}

		// Compute block errors
		uint64_t total_t_err = 0, total_hint0_err = 0, total_hint1_err = 0;
		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				total_t_err += color_distance(perceptual, block[y][x], tblock_bc1[y][x], false);
				total_hint0_err += color_distance(perceptual, block[y][x], tblock_hint0_bc1[y][x], false);
				total_hint1_err += color_distance(perceptual, block[y][x], tblock_hint1_bc1[y][x], false);
			}
		}

		const float t_err = sqrtf((float)total_t_err);
		const float t_err_hint0 = sqrtf((float)total_hint0_err);
		const float t_err_hint1 = sqrtf((float)total_hint1_err);

		const float err_thresh0 = 1.075f;
		const float err_thresh1 = 1.075f;
		
		if ((g_uastc_mode_has_bc1_hint0[best_mode]) && (t_err_hint0 <= t_err * err_thresh0))
			bc1_hint0 = true;

		if ((g_uastc_mode_has_bc1_hint1[best_mode]) && (t_err_hint1 <= t_err * err_thresh1))
			bc1_hint1 = true;
	}